

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_status fdb_get_kvs_seqnum(fdb_kvs_handle *handle,fdb_seqnum_t *seqnum)

{
  filemgr *file;
  fdb_kvs_id_t id;
  fdb_seqnum_t fVar1;
  bool bVar2;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (seqnum == (fdb_seqnum_t *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  LOCK();
  bVar2 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
  if (bVar2) {
    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
  }
  UNLOCK();
  if (!bVar2) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  if (handle->shandle == (snap_handle *)0x0) {
    fdb_check_file_reopen(handle,(file_status_t *)0x0);
    fdb_sync_db_header(handle);
    file = handle->file;
    if ((handle->kvs == (kvs_info *)0x0) || (id = handle->kvs->id, id == 0)) {
      filemgr_mutex_lock(file);
      fVar1 = filemgr_get_seqnum(file);
      *seqnum = fVar1;
      filemgr_mutex_unlock(file);
      goto LAB_001473fd;
    }
    fVar1 = fdb_kvs_get_seqnum(file,id);
  }
  else {
    fVar1 = handle->max_seqnum;
  }
  *seqnum = fVar1;
LAB_001473fd:
  LOCK();
  if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
  }
  UNLOCK();
  return FDB_RESULT_SUCCESS;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_seqnum(fdb_kvs_handle *handle, fdb_seqnum_t *seqnum)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!seqnum) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (handle->shandle) {
        // handle for snapshot
        // return MAX_SEQNUM instead of the file's sequence number
        *seqnum = handle->max_seqnum;
    } else {
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);

        struct filemgr *file;
        file = handle->file;

        if (handle->kvs == NULL ||
            handle->kvs->id == 0) {
            filemgr_mutex_lock(file);
            *seqnum = filemgr_get_seqnum(file);
            filemgr_mutex_unlock(file);
        } else {
            *seqnum = fdb_kvs_get_seqnum(file, handle->kvs->id);
        }
    }
    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}